

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

bool __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
::InstMatcher::TermSpec::isFinal(TermSpec *this)

{
  bool bVar1;
  byte *in_RDI;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  if ((*in_RDI & 1) == 0) {
    bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x52a2d7);
    local_13 = true;
    if (!bVar1) {
      bVar1 = Kernel::TermList::isTerm((TermList *)0x52a2f2);
      local_14 = false;
      if (bVar1) {
        Kernel::TermList::term((TermList *)0x52a30f);
        local_14 = Kernel::Term::shared((Term *)0x52a317);
      }
      local_13 = local_14;
    }
    local_12 = local_13;
  }
  else {
    bVar1 = Kernel::TermList::isTerm((TermList *)0x52a296);
    local_11 = false;
    if (bVar1) {
      Kernel::TermList::term((TermList *)0x52a2b3);
      local_11 = Kernel::Term::ground((Term *)0x52a2bb);
    }
    local_12 = local_11;
  }
  return local_12;
}

Assistant:

bool isFinal()
        {
          //the fact that a term is shared means it does not contain any special variables
          return q
        ? (t.isTerm() && t.term()->ground())
        : (t.isOrdinaryVar() || (t.isTerm() && t.term()->shared()) );
        }